

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void xmlVFormatLegacyError(void *ctx,char *level,char *fmt,__va_list_tag *ap)

{
  xmlParserInputPtr pxVar1;
  xmlGenericErrorFunc p_Var2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlChar *local_48;
  xmlChar *str;
  xmlParserInputPtr cur;
  xmlParserInputPtr input;
  xmlParserCtxtPtr ctxt;
  __va_list_tag *ap_local;
  char *fmt_local;
  char *level_local;
  void *ctx_local;
  
  cur = (xmlParserInputPtr)0x0;
  str = (xmlChar *)0x0;
  local_48 = (xmlChar *)0x0;
  input = (xmlParserInputPtr)ctx;
  ctxt = (xmlParserCtxtPtr)ap;
  ap_local = (__va_list_tag *)fmt;
  fmt_local = level;
  level_local = (char *)ctx;
  if (ctx != (void *)0x0) {
    pxVar1 = *(xmlParserInputPtr *)((long)ctx + 0x38);
    cur = pxVar1;
    if (((pxVar1 != (xmlParserInputPtr)0x0) && (pxVar1->filename == (char *)0x0)) &&
       (1 < *(int *)((long)ctx + 0x40))) {
      cur = *(xmlParserInputPtr *)
             (*(long *)((long)ctx + 0x48) + (long)(*(int *)((long)ctx + 0x40) + -2) * 8);
      str = (xmlChar *)pxVar1;
    }
    xmlParserPrintFileInfo(cur);
  }
  pp_Var3 = __xmlGenericError();
  p_Var2 = *pp_Var3;
  ppvVar4 = __xmlGenericErrorContext();
  (*p_Var2)(*ppvVar4,"%s: ",fmt_local);
  xmlStrVASPrintf(&local_48,64000,(char *)ap_local,(__va_list_tag *)ctxt);
  if (local_48 != (xmlChar *)0x0) {
    pp_Var3 = __xmlGenericError();
    p_Var2 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*p_Var2)(*ppvVar4,"%s",local_48);
    (*xmlFree)(local_48);
  }
  if ((input != (xmlParserInputPtr)0x0) && (xmlParserPrintFileContext(cur), str != (xmlChar *)0x0))
  {
    xmlParserPrintFileInfo((xmlParserInputPtr)str);
    pp_Var3 = __xmlGenericError();
    p_Var2 = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*p_Var2)(*ppvVar4,"\n");
    xmlParserPrintFileContext((xmlParserInputPtr)str);
  }
  return;
}

Assistant:

static void
xmlVFormatLegacyError(void *ctx, const char *level,
                      const char *fmt, va_list ap) {
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;
    xmlParserInputPtr input = NULL;
    xmlParserInputPtr cur = NULL;
    xmlChar *str = NULL;

    if (ctxt != NULL) {
	input = ctxt->input;
	if ((input != NULL) && (input->filename == NULL) &&
	    (ctxt->inputNr > 1)) {
	    cur = input;
	    input = ctxt->inputTab[ctxt->inputNr - 2];
	}
	xmlParserPrintFileInfo(input);
    }

    xmlGenericError(xmlGenericErrorContext, "%s: ", level);

    xmlStrVASPrintf(&str, MAX_ERR_MSG_SIZE, fmt, ap);
    if (str != NULL) {
        xmlGenericError(xmlGenericErrorContext, "%s", (char *) str);
	xmlFree(str);
    }

    if (ctxt != NULL) {
	xmlParserPrintFileContext(input);
	if (cur != NULL) {
	    xmlParserPrintFileInfo(cur);
	    xmlGenericError(xmlGenericErrorContext, "\n");
	    xmlParserPrintFileContext(cur);
	}
    }
}